

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O1

bool __thiscall
psy::C::SyntaxWriterDOTFormat::preVisit(SyntaxWriterDOTFormat *this,SyntaxNode *node)

{
  iterator *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint __val;
  uint uVar4;
  long *plVar5;
  mapped_type *pmVar6;
  uint uVar7;
  size_type *psVar8;
  ulong uVar9;
  _Elt_pointer ppSVar10;
  uint __len;
  string id;
  string __str;
  SyntaxNode *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  uVar3 = this->count_;
  this->count_ = uVar3 + 1;
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_002af973;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_002af973;
      }
      if (uVar7 < 10000) goto LAB_002af973;
      uVar9 = uVar9 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_002af973:
  paVar2 = &local_70.first.field_2;
  local_98 = node;
  local_70.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70.first._M_dataplus._M_p + (uVar3 >> 0x1f),__len,__val);
  plVar5 = (long *)std::__cxx11::string::insert((ulong)&local_70,0,'\x01');
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90.field_2._8_8_ = plVar5[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_90._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  pmVar6 = std::__detail::
           _Map_base<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->id_,&local_98);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  ppSVar10 = (this->nodes_).c.
             super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar10 !=
      (this->nodes_).c.
      super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppSVar10 ==
        (this->nodes_).c.
        super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar10 = (this->nodes_).c.
                 super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pmVar6 = std::__detail::
             _Map_base<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->id_,ppSVar10 + -1);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_70,pmVar6,&local_90);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->connections_,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
      operator_delete(local_70.second._M_dataplus._M_p,
                      local_70.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.first._M_dataplus._M_p,
                      local_70.first.field_2._M_allocated_capacity + 1);
    }
  }
  ppSVar10 = (this->nodes_).c.
             super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar10 ==
      (this->nodes_).c.
      super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<psy::C::SyntaxNode_const*,std::allocator<psy::C::SyntaxNode_const*>>::
    _M_push_back_aux<psy::C::SyntaxNode_const*const&>
              ((deque<psy::C::SyntaxNode_const*,std::allocator<psy::C::SyntaxNode_const*>> *)
               &this->nodes_,&local_98);
  }
  else {
    *ppSVar10 = local_98;
    piVar1 = &(this->nodes_).c.
              super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  nodeLabel(this,local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool SyntaxWriterDOTFormat::preVisit(const SyntaxNode* node)
{
    const std::string id = 'n' + std::to_string(count_++);
    id_[node] = id;

    if (!nodes_.empty())
        connections_.push_back(std::make_pair(id_[nodes_.top()], id));

    nodes_.push(node);

    nodeLabel(node);

    return true;
}